

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_thread_identity.cc
# Opt level: O3

void absl::lts_20250127::synchronization_internal::ReclaimThreadIdentity(void *v)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (*(void **)((long)v + 0x38) != (void *)0x0) {
    base_internal::LowLevelAlloc::Free(*(void **)((long)v + 0x38));
  }
  base_internal::ClearCurrentThreadIdentity();
  if ((freelist_lock & 1) == 0) {
    uVar2 = freelist_lock | 1;
    LOCK();
    UNLOCK();
    uVar1 = freelist_lock & 1;
    freelist_lock = uVar2;
    if (uVar1 == 0) goto LAB_002a412c;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&freelist_lock);
LAB_002a412c:
  *(void **)((long)v + 0x158) = thread_identity_freelist;
  uVar1 = freelist_lock;
  uVar2 = freelist_lock & 2;
  LOCK();
  UNLOCK();
  bVar3 = 7 < freelist_lock;
  thread_identity_freelist = v;
  freelist_lock = uVar2;
  if (bVar3) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&freelist_lock,uVar1);
  }
  return;
}

Assistant:

static void ReclaimThreadIdentity(void* v) {
  base_internal::ThreadIdentity* identity =
      static_cast<base_internal::ThreadIdentity*>(v);

  // all_locks might have been allocated by the Mutex implementation.
  // We free it here when we are notified that our thread is dying.
  if (identity->per_thread_synch.all_locks != nullptr) {
    base_internal::LowLevelAlloc::Free(identity->per_thread_synch.all_locks);
  }

  // We must explicitly clear the current thread's identity:
  // (a) Subsequent (unrelated) per-thread destructors may require an identity.
  //     We must guarantee a new identity is used in this case (this instructor
  //     will be reinvoked up to PTHREAD_DESTRUCTOR_ITERATIONS in this case).
  // (b) ThreadIdentity implementations may depend on memory that is not
  //     reinitialized before reuse.  We must allow explicit clearing of the
  //     association state in this case.
  base_internal::ClearCurrentThreadIdentity();
  {
    base_internal::SpinLockHolder l(&freelist_lock);
    identity->next = thread_identity_freelist;
    thread_identity_freelist = identity;
  }
}